

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::ConflictSet::conflictAnalysis
          (ConflictSet *this,HighsInt *proofinds,double *proofvals,HighsInt prooflen,double proofrhs
          ,HighsConflictPool *conflictPool)

{
  pointer ppVar1;
  double dVar2;
  int iVar3;
  pointer pLVar4;
  __normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
  __last;
  __normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
  __first;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var5;
  HighsDomain *pHVar6;
  bool bVar7;
  HighsInt HVar8;
  ulong uVar9;
  ulong uVar10;
  int depthLevel;
  HighsPseudocost *this_00;
  int iVar11;
  int iVar12;
  int iVar13;
  LocalDomChg *locdomchg;
  pointer pLVar14;
  HighsInt ninfmin;
  HighsCDouble activitymin;
  
  std::
  vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  ::reserve(&this->resolvedDomainChanges,
            (long)(this->localdom->domchgstack_).
                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->localdom->domchgstack_).
                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4);
  computeMinActivity(this->globaldom,0,prooflen,proofinds,proofvals,&ninfmin,&activitymin);
  if ((ninfmin == 0) &&
     (bVar7 = explainInfeasibilityLeq
                        (this,proofinds,proofvals,prooflen,proofrhs,activitymin.hi + activitymin.lo)
     , bVar7)) {
    HighsPseudocost::increaseConflictWeight
              (&((this->localdom->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->pseudocost);
    pLVar4 = (this->resolvedDomainChanges).
             super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pLVar14 = (this->resolvedDomainChanges).
                   super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                   ._M_impl.super__Vector_impl_data._M_start; pLVar14 != pLVar4;
        pLVar14 = pLVar14 + 1) {
      this_00 = &((this->localdom->mipsolver->mipdata_)._M_t.
                  super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                  .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->pseudocost;
      HVar8 = (pLVar14->domchg).column;
      if ((pLVar14->domchg).boundtype == kLower) {
        HighsPseudocost::increaseConflictScoreUp(this_00,HVar8);
      }
      else {
        HighsPseudocost::increaseConflictScoreDown(this_00,HVar8);
      }
    }
    __last._M_current =
         (this->resolvedDomainChanges).
         super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    __first._M_current =
         (this->resolvedDomainChanges).
         super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
         ._M_impl.super__Vector_impl_data._M_start;
    _Var5._M_head_impl =
         (this->localdom->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    uVar9 = (((long)__last._M_current - (long)__first._M_current) / 0x18) * 10;
    uVar10 = ((long)*(pointer *)((long)&(_Var5._M_head_impl)->integral_cols + 8) -
              *(long *)&((_Var5._M_head_impl)->integral_cols).
                        super__Vector_base<int,_std::allocator<int>_> >> 2) * 3 + 1000;
    if (uVar9 < uVar10 || uVar9 - uVar10 == 0) {
      std::
      _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
      ::
      _M_insert_range_unique<__gnu_cxx::__normal_iterator<HighsDomain::ConflictSet::LocalDomChg*,std::vector<HighsDomain::ConflictSet::LocalDomChg,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>>>
                ((_Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
                  *)&this->reasonSideFrontier,__first,__last);
      uVar10 = (ulong)((long)(this->localdom->branchPos_).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(this->localdom->branchPos_).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2;
      iVar12 = -(int)uVar10;
      iVar13 = 0;
      uVar9 = uVar10 & 0xffffffff;
      while( true ) {
        depthLevel = (int)uVar9;
        iVar11 = (int)uVar10;
        if (depthLevel < 0) break;
        if (depthLevel == 0) {
LAB_002a5046:
          HVar8 = computeCuts(this,depthLevel,conflictPool);
          if (HVar8 == -1) goto LAB_002a5074;
          iVar13 = iVar13 + HVar8;
          if ((iVar13 == 0) || (3 < iVar11 + iVar12 && HVar8 == 0)) break;
        }
        else {
          pHVar6 = this->localdom;
          iVar3 = (pHVar6->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9 - 1];
          dVar2 = (pHVar6->domchgstack_).
                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar3].boundval;
          ppVar1 = (pHVar6->prevboundval_).
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar3;
          if ((dVar2 != ppVar1->first) || (NAN(dVar2) || NAN(ppVar1->first))) goto LAB_002a5046;
LAB_002a5074:
          uVar10 = (ulong)(iVar11 - 1);
        }
        iVar12 = iVar12 + 1;
        uVar9 = (ulong)(depthLevel - 1);
      }
      if (depthLevel == iVar11) {
        HighsConflictPool::addConflictCut(conflictPool,this->localdom,&this->reasonSideFrontier);
      }
    }
  }
  return;
}

Assistant:

void HighsDomain::ConflictSet::conflictAnalysis(
    const HighsInt* proofinds, const double* proofvals, HighsInt prooflen,
    double proofrhs, HighsConflictPool& conflictPool) {
  resolvedDomainChanges.reserve(localdom.domchgstack_.size());

  HighsInt ninfmin;
  HighsCDouble activitymin;
  globaldom.computeMinActivity(0, prooflen, proofinds, proofvals, ninfmin,
                               activitymin);
  if (ninfmin != 0) return;

  if (!explainInfeasibilityLeq(proofinds, proofvals, prooflen, proofrhs,
                               double(activitymin)))
    return;

  localdom.mipsolver->mipdata_->pseudocost.increaseConflictWeight();
  for (const LocalDomChg& locdomchg : resolvedDomainChanges) {
    if (locdomchg.domchg.boundtype == HighsBoundType::kLower)
      localdom.mipsolver->mipdata_->pseudocost.increaseConflictScoreUp(
          locdomchg.domchg.column);
    else
      localdom.mipsolver->mipdata_->pseudocost.increaseConflictScoreDown(
          locdomchg.domchg.column);
  }

  if (10 * resolvedDomainChanges.size() >
      1000 + 3 * localdom.mipsolver->mipdata_->integral_cols.size())
    return;

  reasonSideFrontier.insert(resolvedDomainChanges.begin(),
                            resolvedDomainChanges.end());

  assert(resolvedDomainChanges.size() == reasonSideFrontier.size());

  localdom.mipsolver->mipdata_->debugSolution.checkConflictReasonFrontier(
      reasonSideFrontier, localdom.domchgstack_);

  HighsInt numConflicts = 0;
  HighsInt lastDepth = localdom.branchPos_.size();
  HighsInt currDepth;
  for (currDepth = lastDepth; currDepth >= 0; --currDepth) {
    if (currDepth > 0) {
      // skip redundant branching changes which are just added for symmetry
      // handling
      HighsInt branchpos = localdom.branchPos_[currDepth - 1];
      if (localdom.domchgstack_[branchpos].boundval ==
          localdom.prevboundval_[branchpos].first) {
        --lastDepth;
        continue;
      }
    }
    HighsInt numNewConflicts = computeCuts(currDepth, conflictPool);
    // if the depth level was empty, do not consider it
    if (numNewConflicts == -1) {
      --lastDepth;
      continue;
    }

    numConflicts += numNewConflicts;
    // if no conflict was found in the first non-empty depth level we stop here
    if (numConflicts == 0) break;
    // if no conflict was found in this depth level and all conflicts of the
    // first 5 non-empty depth levels are generated we stop here
    if (lastDepth - currDepth >= 4 && numNewConflicts == 0) break;
  }

  // if we stopped in the highest non-empty depth it means no conflicts where
  // added yet. We want to at least add the current conflict frontier as it
  // means the bound change leading to infeasibility was the last branching
  // itself and hence should have been propagated in the previous depth but was
  // not, e.g. because the threshold for an integral variable was not reached.
  if (currDepth == lastDepth)
    conflictPool.addConflictCut(localdom, reasonSideFrontier);
}